

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::GyroscopeSensor::getName_abi_cxx11_(string *__return_storage_ptr__,GyroscopeSensor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->pimpl);
  return __return_storage_ptr__;
}

Assistant:

std::string GyroscopeSensor::getName() const
{
    return this->pimpl->name;
}